

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

RunStats __thiscall soul::ResolutionPass::run(ResolutionPass *this,bool ignoreTypeAndConstantErrors)

{
  ModuleBase *pMVar1;
  Allocator *a;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  ulong uVar3;
  undefined7 in_register_00000031;
  RunStats RVar4;
  RunStats local_b8;
  undefined1 local_a0 [48];
  ushort local_70;
  uint64_t local_68;
  pool_ptr<soul::AST::Statement> local_60;
  pool_ptr<soul::AST::Connection::SharedEndpoint> pStack_58;
  pool_ptr<soul::AST::ModuleBase> local_50;
  uint64_t uStack_48;
  undefined4 local_34;
  
  pMVar1 = this->module;
  if (pMVar1->isFullyResolved == false) {
    if ((pMVar1->specialisationParams).
        super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pMVar1->specialisationParams).
        super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_34 = (undefined4)CONCAT71(in_register_00000031,ignoreTypeAndConstantErrors);
      do {
        local_b8.numFailures = 0;
        local_b8.numReplaced = 0;
        local_a0._8_8_ = (ModuleBase *)0x0;
        local_a0._24_8_ = this->allocator;
        local_a0._32_8_ = this->module;
        local_a0._40_8_ = 0;
        local_70._0_1_ = true;
        local_68 = 100;
        local_a0._0_8_ = &PTR__QualifiedIdentifierResolver_002ccce8;
        local_50.object = (ModuleBase *)0x0;
        uStack_48 = 0;
        local_60.object = (Statement *)0x0;
        pStack_58.object = (SharedEndpoint *)0x0;
        local_a0._16_8_ = this;
        QualifiedIdentifierResolver::performPass((QualifiedIdentifierResolver *)local_a0);
        local_b8.numFailures = local_b8.numFailures + local_a0._40_8_;
        local_b8.numReplaced =
             (long)&((ASTObject *)local_a0._8_8_)->_vptr_ASTObject + local_b8.numReplaced;
        tryPass<soul::ResolutionPass::TypeResolver>(this,&local_b8,true);
        local_a0._8_8_ = (ModuleBase *)0x0;
        local_a0._24_8_ = this->allocator;
        local_a0._32_8_ = this->module;
        local_a0._40_8_ = 0;
        local_70._0_1_ = true;
        local_68 = 100;
        local_a0._0_8_ = &PTR__RewritingASTVisitor_002cda98;
        local_a0._16_8_ = this;
        RewritingASTVisitor::visitObject
                  ((RewritingASTVisitor *)local_a0,(ModuleBase *)local_a0._32_8_);
        local_b8.numFailures = local_b8.numFailures + local_a0._40_8_;
        local_b8.numReplaced =
             (long)&((ASTObject *)local_a0._8_8_)->_vptr_ASTObject + local_b8.numReplaced;
        local_a0._8_8_ = (ModuleBase *)0x0;
        local_a0._24_8_ = this->allocator;
        local_a0._32_8_ = this->module;
        local_a0._40_8_ = 0;
        local_70._0_1_ = true;
        local_68 = 100;
        local_a0._0_8_ = &PTR__RewritingASTVisitor_002cdc90;
        local_a0._16_8_ = this;
        RewritingASTVisitor::visitObject
                  ((RewritingASTVisitor *)local_a0,(ModuleBase *)local_a0._32_8_);
        local_b8.numFailures = local_b8.numFailures + local_a0._40_8_;
        local_b8.numReplaced =
             (long)&((ASTObject *)local_a0._8_8_)->_vptr_ASTObject + local_b8.numReplaced;
        local_a0._8_8_ = (ModuleBase *)0x0;
        local_a0._24_8_ = this->allocator;
        local_a0._32_8_ = this->module;
        local_a0._40_8_ = 0;
        local_70._0_1_ = true;
        local_a0._0_8_ = &PTR__RewritingASTVisitor_002cde78;
        local_a0._16_8_ = this;
        RewritingASTVisitor::visitObject
                  ((RewritingASTVisitor *)local_a0,(ModuleBase *)local_a0._32_8_);
        local_b8.numFailures = local_b8.numFailures + local_a0._40_8_;
        local_b8.numReplaced =
             (long)&((ASTObject *)local_a0._8_8_)->_vptr_ASTObject + local_b8.numReplaced;
        rebuildVariableUseCounts(this->module);
        local_a0._8_8_ = (ModuleBase *)0x0;
        local_a0._24_8_ = this->allocator;
        local_a0._32_8_ = this->module;
        local_a0._40_8_ = 0;
        local_70 = CONCAT11(local_70._1_1_,true);
        local_a0._0_8_ = &PTR__RewritingASTVisitor_002ce510;
        local_a0._16_8_ = this;
        RewritingASTVisitor::visitObject
                  ((RewritingASTVisitor *)local_a0,(ModuleBase *)local_a0._32_8_);
        local_b8.numFailures = local_b8.numFailures + local_a0._40_8_;
        local_b8.numReplaced =
             (long)&((ASTObject *)local_a0._8_8_)->_vptr_ASTObject + local_b8.numReplaced;
        local_a0._8_8_ = (ModuleBase *)0x0;
        local_a0._24_8_ = this->allocator;
        local_a0._32_8_ = this->module;
        local_a0._40_8_ = 0;
        local_70 = 1;
        local_a0._0_8_ = &PTR__RewritingASTVisitor_002ce868;
        local_a0._16_8_ = this;
        RewritingASTVisitor::visitObject
                  ((RewritingASTVisitor *)local_a0,(ModuleBase *)local_a0._32_8_);
        local_b8.numFailures = local_b8.numFailures + local_a0._40_8_;
        local_b8.numReplaced =
             (long)&((ASTObject *)local_a0._8_8_)->_vptr_ASTObject + local_b8.numReplaced;
        rebuildVariableUseCounts(this->module);
        if (local_b8.numReplaced == 0) {
          local_a0._8_8_ = (ModuleBase *)0x0;
          local_a0._24_8_ = this->allocator;
          local_a0._32_8_ = this->module;
          local_a0._40_8_ = 0;
          local_70 = CONCAT11(local_70._1_1_,1);
          local_a0._0_8_ = &PTR__RewritingASTVisitor_002cea50;
          local_a0._16_8_ = this;
          RewritingASTVisitor::visitObject
                    ((RewritingASTVisitor *)local_a0,(ModuleBase *)local_a0._32_8_);
          local_b8.numFailures = local_b8.numFailures + local_a0._40_8_;
          local_b8.numReplaced =
               (long)&((ASTObject *)local_a0._8_8_)->_vptr_ASTObject + local_b8.numReplaced;
        }
        iVar2 = (*(this->module->super_Scope)._vptr_Scope[0x11])(&this->module->super_Scope);
        if (extraout_RDX != CONCAT44(extraout_var,iVar2)) {
          uVar3 = 0;
          do {
            a = this->allocator;
            iVar2 = (*(this->module->super_Scope)._vptr_Scope[0x11])(&this->module->super_Scope);
            if ((ulong)(extraout_RDX_00 - CONCAT44(extraout_var_00,iVar2) >> 3) <= uVar3) {
              throwInternalCompilerError("i < size()","operator[]",0xc4);
            }
            ResolutionPass((ResolutionPass *)local_a0,a,
                           *(ModuleBase **)(CONCAT44(extraout_var_00,iVar2) + uVar3 * 8));
            RVar4 = run((ResolutionPass *)local_a0,ignoreTypeAndConstantErrors);
            local_b8.numFailures = local_b8.numFailures + RVar4.numFailures;
            local_b8.numReplaced = local_b8.numReplaced + RVar4.numReplaced;
            local_a0._24_8_ = (Allocator *)0x0;
            if (((ModuleBase *)0x8 < (ulong)local_a0._32_8_) &&
               ((ResolutionPass *)local_a0._16_8_ != (ResolutionPass *)0x0)) {
              operator_delete__((void *)local_a0._16_8_);
            }
            uVar3 = uVar3 + 1;
            iVar2 = (*(this->module->super_Scope)._vptr_Scope[0x11])(&this->module->super_Scope);
          } while (uVar3 < (ulong)(extraout_RDX_01 - CONCAT44(extraout_var_01,iVar2) >> 3));
        }
        if (local_b8.numFailures == 0) goto LAB_001e865b;
      } while (local_b8.numReplaced != 0);
      if ((char)local_34 == '\0') {
        local_a0._8_8_ = (ModuleBase *)0x0;
        local_a0._24_8_ = this->allocator;
        local_a0._32_8_ = this->module;
        local_a0._40_8_ = 0;
        local_70 = local_70 & 0xff00;
        local_a0._0_8_ = &PTR__RewritingASTVisitor_002ce510;
        local_a0._16_8_ = this;
        RewritingASTVisitor::visitObject
                  ((RewritingASTVisitor *)local_a0,(ModuleBase *)local_a0._32_8_);
        local_b8.numFailures = local_b8.numFailures + local_a0._40_8_;
        local_b8.numReplaced =
             (long)&((ASTObject *)local_a0._8_8_)->_vptr_ASTObject + local_b8.numReplaced;
        local_a0._8_8_ = (ModuleBase *)0x0;
        local_a0._24_8_ = this->allocator;
        local_a0._32_8_ = this->module;
        local_a0._40_8_ = 0;
        local_70 = local_70 & 0xff00;
        local_68 = 100;
        local_a0._0_8_ = &PTR__QualifiedIdentifierResolver_002ccce8;
        local_60.object = (Statement *)0x0;
        pStack_58.object = (SharedEndpoint *)0x0;
        local_50.object = (ModuleBase *)0x0;
        uStack_48 = 0;
        local_a0._16_8_ = this;
        QualifiedIdentifierResolver::performPass((QualifiedIdentifierResolver *)local_a0);
        local_b8.numFailures = local_b8.numFailures + local_a0._40_8_;
        local_b8.numReplaced =
             (long)&((ASTObject *)local_a0._8_8_)->_vptr_ASTObject + local_b8.numReplaced;
        tryPass<soul::ResolutionPass::TypeResolver>(this,&local_b8,false);
        local_a0._8_8_ = (ModuleBase *)0x0;
        local_a0._24_8_ = this->allocator;
        local_a0._32_8_ = this->module;
        local_a0._40_8_ = 0;
        local_70 = local_70 & 0xff00;
        local_68 = 100;
        local_a0._0_8_ = &PTR__RewritingASTVisitor_002cda98;
        local_a0._16_8_ = this;
        RewritingASTVisitor::visitObject
                  ((RewritingASTVisitor *)local_a0,(ModuleBase *)local_a0._32_8_);
        local_b8.numFailures = local_b8.numFailures + local_a0._40_8_;
        local_b8.numReplaced =
             (long)&((ASTObject *)local_a0._8_8_)->_vptr_ASTObject + local_b8.numReplaced;
        local_a0._8_8_ = (ModuleBase *)0x0;
        local_a0._24_8_ = this->allocator;
        local_a0._32_8_ = this->module;
        local_a0._40_8_ = 0;
        local_70 = local_70 & 0xff00;
        local_68 = 100;
        local_a0._0_8_ = &PTR__RewritingASTVisitor_002cdc90;
        local_a0._16_8_ = this;
        RewritingASTVisitor::visitObject
                  ((RewritingASTVisitor *)local_a0,(ModuleBase *)local_a0._32_8_);
        local_b8.numFailures = local_b8.numFailures + local_a0._40_8_;
        local_b8.numReplaced =
             (long)&((ASTObject *)local_a0._8_8_)->_vptr_ASTObject + local_b8.numReplaced;
        local_a0._8_8_ = (ModuleBase *)0x0;
        local_a0._24_8_ = this->allocator;
        local_a0._32_8_ = this->module;
        local_a0._40_8_ = 0;
        local_70 = local_70 & 0xff00;
        local_a0._0_8_ = &PTR__RewritingASTVisitor_002cde78;
        local_a0._16_8_ = this;
        RewritingASTVisitor::visitObject
                  ((RewritingASTVisitor *)local_a0,(ModuleBase *)local_a0._32_8_);
        local_b8.numFailures = local_b8.numFailures + local_a0._40_8_;
        local_b8.numReplaced =
             (long)&((ASTObject *)local_a0._8_8_)->_vptr_ASTObject + local_b8.numReplaced;
        local_a0._8_8_ = (ModuleBase *)0x0;
        local_a0._24_8_ = this->allocator;
        local_a0._32_8_ = this->module;
        local_a0._40_8_ = 0;
        local_70 = local_70 & 0xff00;
        local_a0._0_8_ = &PTR__RewritingASTVisitor_002cea50;
        local_a0._16_8_ = this;
        RewritingASTVisitor::visitObject
                  ((RewritingASTVisitor *)local_a0,(ModuleBase *)local_a0._32_8_);
        local_b8.numFailures = local_b8.numFailures + local_a0._40_8_;
        local_b8.numReplaced =
             (long)&((ASTObject *)local_a0._8_8_)->_vptr_ASTObject + local_b8.numReplaced;
LAB_001e865b:
        SanityCheckPass::runPostResolutionChecks(this->module);
        this->module->isFullyResolved = true;
      }
      else {
        local_b8.numReplaced = 0;
      }
      goto LAB_001e8135;
    }
    pMVar1->isFullyResolved = true;
  }
  local_b8.numReplaced = 0;
  local_b8.numFailures = 0;
LAB_001e8135:
  RVar4.numReplaced = local_b8.numReplaced;
  RVar4.numFailures = local_b8.numFailures;
  return RVar4;
}

Assistant:

RunStats run (bool ignoreTypeAndConstantErrors)
    {
        RunStats runStats;

        if (module.isFullyResolved)
            return runStats;

        if (module.isTemplateModule())
        {
            module.isFullyResolved = true;
            return runStats;
        }

        for (;;)
        {
            runStats.clear();

            tryPass<QualifiedIdentifierResolver> (runStats, true);
            tryPass<TypeResolver> (runStats, true);
            tryPass<ProcessorInstanceResolver> (runStats, true);
            tryPass<NamespaceAliasResolver> (runStats, true);
            tryPass<OperatorResolver> (runStats, true);
            rebuildVariableUseCounts (module);
            tryPass<FunctionResolver> (runStats, true);
            tryPass<ConstantFolder> (runStats, true);

            rebuildVariableUseCounts (module);

            if (runStats.numReplaced == 0)
                tryPass<GenericFunctionResolver> (runStats, true);

            // Can't use a range-based-for here because the array will change during the loop
            for (size_t i = 0; i < module.getSubModules().size(); ++i)
                runStats.add (ResolutionPass (allocator, module.getSubModules()[i])
                                .run (ignoreTypeAndConstantErrors));

            if (runStats.numFailures == 0)
                break;

            if (runStats.numReplaced == 0)
            {
                // failed to resolve anything new, so can't get any further..
                if (ignoreTypeAndConstantErrors)
                    return runStats;

                tryPass<FunctionResolver> (runStats, false);
                tryPass<QualifiedIdentifierResolver> (runStats, false);
                tryPass<TypeResolver> (runStats, false);
                tryPass<ProcessorInstanceResolver> (runStats, false);
                tryPass<NamespaceAliasResolver> (runStats, false);
                tryPass<OperatorResolver> (runStats, false);
                tryPass<GenericFunctionResolver> (runStats, false);
                break;
            }
        }

        SanityCheckPass::runPostResolutionChecks (module);

        module.isFullyResolved = true;
        return runStats;
    }